

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::doWalkModule(I64ToI32Lowering *this,Module *module)

{
  IString str;
  bool bVar1;
  reference this_00;
  pointer pBVar2;
  Const *pCVar3;
  pointer pGVar4;
  GlobalGet *pGVar5;
  Global *this_01;
  char *extraout_RDX;
  char *extraout_RDX_00;
  string_view sVar6;
  Name n;
  Name n_00;
  Name name;
  Name local_2b8;
  Type local_2a8;
  Global *local_2a0;
  Global *highBits;
  Type local_290;
  wasm *local_288;
  char *pcStack_280;
  string_view local_270;
  GlobalGet *local_260;
  GlobalGet *get;
  Literal local_250;
  undefined8 local_238;
  uint64_t value;
  Const *c;
  Type local_90;
  wasm *local_88;
  char *pcStack_80;
  string_view local_70;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_60;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> high;
  BasicType local_3c;
  pointer local_38;
  Global *curr;
  size_t globals;
  size_t i;
  Module *local_18;
  Module *module_local;
  I64ToI32Lowering *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->builder);
  if (!bVar1) {
    std::make_unique<wasm::Builder,wasm::Module&>((Module *)&i);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator=
              (&this->builder,(unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&i);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&i);
  }
  globals = 0;
  curr = (Global *)
         std::
         vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
         ::size(&local_18->globals);
  do {
    if (curr <= globals) {
      this_01 = (Global *)operator_new(0x50);
      this_01->init = (Expression *)0x0;
      *(undefined8 *)&this_01->mutable_ = 0;
      (this_01->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (this_01->type).id = 0;
      (this_01->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      (this_01->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&(this_01->super_Importable).super_Named.hasExplicitName = 0;
      (this_01->super_Importable).module.super_IString.str._M_len = 0;
      (this_01->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      (this_01->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
      Global::Global(this_01);
      local_2a0 = this_01;
      wasm::Type::Type(&local_2a8,i32);
      (local_2a0->type).id = local_2a8.id;
      str.str._M_str = DAT_03192cd8;
      str.str._M_len = INT64_TO_32_HIGH_BITS;
      wasm::Name::Name(&local_2b8,str);
      wasm::Name::operator=((Name *)local_2a0,&local_2b8);
      pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pCVar3 = Builder::makeConst<int>(pBVar2,0);
      local_2a0->init = (Expression *)pCVar3;
      local_2a0->mutable_ = true;
      Module::addGlobal(local_18,local_2a0);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::doWalkModule
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,local_18);
      return;
    }
    this_00 = std::
              vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ::operator[](&local_18->globals,globals);
    local_38 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(this_00);
    local_3c = i64;
    bVar1 = wasm::Type::operator!=(&local_38->type,&local_3c);
    if (!bVar1) {
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert(&this->originallyI64Globals,(value_type *)local_38);
      wasm::Type::Type((Type *)&high,i32);
      (local_38->type).id =
           (uintptr_t)
           high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                (&this->builder);
      local_88 = (wasm *)(local_38->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_80 = (local_38->super_Importable).super_Named.name.super_IString.str._M_str;
      n.super_IString.str._M_str = extraout_RDX;
      n.super_IString.str._M_len = (size_t)pcStack_80;
      local_70 = (string_view)makeHighName(local_88,n);
      wasm::Type::Type(&local_90,i32);
      pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pCVar3 = Builder::makeConst<int>(pBVar2,0);
      name.super_IString.str._M_str = (char *)local_70._M_len;
      name.super_IString.str._M_len = (size_t)&local_60;
      Builder::makeGlobal(name,(Type)local_70._M_str,(Expression *)local_90.id,(Mutability)pCVar3);
      bVar1 = Importable::imported(&local_38->super_Importable);
      if (bVar1) {
        Fatal::Fatal((Fatal *)&c);
        Fatal::operator<<((Fatal *)&c,(char (*) [27])"TODO: imported i64 globals");
        Fatal::~Fatal((Fatal *)&c);
      }
      value = (uint64_t)Expression::dynCast<wasm::Const>(local_38->init);
      if ((Const *)value == (Const *)0x0) {
        local_260 = Expression::dynCast<wasm::GlobalGet>(local_38->init);
        if (local_260 == (GlobalGet *)0x0) {
          handle_unreachable("unexpected expression type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                             ,0x8a);
        }
        pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        local_288 = (wasm *)(local_260->name).super_IString.str._M_len;
        pcStack_280 = (local_260->name).super_IString.str._M_str;
        n_00.super_IString.str._M_str = extraout_RDX_00;
        n_00.super_IString.str._M_len = (size_t)pcStack_280;
        sVar6 = (string_view)makeHighName(local_288,n_00);
        local_270 = sVar6;
        wasm::Type::Type(&local_290,i32);
        pGVar5 = Builder::makeGlobalGet(pBVar2,(Name)local_270,local_290);
        pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_60);
        pGVar4->init = (Expression *)pGVar5;
      }
      else {
        local_238 = wasm::Literal::geti64(&((Const *)value)->value);
        wasm::Literal::Literal(&local_250,(uint32_t)local_238);
        wasm::Literal::operator=((Literal *)(value + 0x10),&local_250);
        wasm::Literal::~Literal(&local_250);
        wasm::Type::Type((Type *)&get,i32);
        *(GlobalGet **)(value + 8) = get;
        pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        pCVar3 = Builder::makeConst<unsigned_int>(pBVar2,local_238._4_4_);
        pGVar4 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (&local_60);
        pGVar4->init = (Expression *)pCVar3;
      }
      wasm::Type::Type((Type *)&highBits,i32);
      (local_38->init->type).id = (uintptr_t)highBits;
      Module::addGlobal(local_18,&local_60);
      std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_60);
    }
    globals = globals + 1;
  } while( true );
}

Assistant:

void doWalkModule(Module* module) {
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    // add new globals for high bits
    for (size_t i = 0, globals = module->globals.size(); i < globals; ++i) {
      auto* curr = module->globals[i].get();
      if (curr->type != Type::i64) {
        continue;
      }
      originallyI64Globals.insert(curr->name);
      curr->type = Type::i32;
      auto high = builder->makeGlobal(makeHighName(curr->name),
                                      Type::i32,
                                      builder->makeConst(int32_t(0)),
                                      curr->mutable_ ? Builder::Mutable
                                                     : Builder::Immutable);
      if (curr->imported()) {
        Fatal() << "TODO: imported i64 globals";
      } else {
        if (auto* c = curr->init->dynCast<Const>()) {
          uint64_t value = c->value.geti64();
          c->value = Literal(uint32_t(value));
          c->type = Type::i32;
          high->init = builder->makeConst(uint32_t(value >> 32));
        } else if (auto* get = curr->init->dynCast<GlobalGet>()) {
          high->init =
            builder->makeGlobalGet(makeHighName(get->name), Type::i32);
        } else {
          WASM_UNREACHABLE("unexpected expression type");
        }
        curr->init->type = Type::i32;
      }
      module->addGlobal(std::move(high));
    }

    // For functions that return 64-bit values, we use this global variable
    // to return the high 32 bits.
    auto* highBits = new Global();
    highBits->type = Type::i32;
    highBits->name = INT64_TO_32_HIGH_BITS;
    highBits->init = builder->makeConst(int32_t(0));
    highBits->mutable_ = true;
    module->addGlobal(highBits);
    PostWalker<I64ToI32Lowering>::doWalkModule(module);
  }